

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.h
# Opt level: O0

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this)

{
  Snapshot snapshot;
  PositionType local_38;
  Snapshot local_28;
  cmLinkImplItem *local_10;
  cmLinkImplItem *this_local;
  
  local_10 = this;
  cmLinkItem::cmLinkItem(&this->super_cmLinkItem);
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_38);
  cmState::Snapshot::Snapshot(&local_28,(cmState *)0x0,local_38);
  snapshot.Position.Tree = local_28.Position.Tree;
  snapshot.State = local_28.State;
  snapshot.Position.Position = local_28.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot);
  this->FromGenex = false;
  return;
}

Assistant:

cmLinkImplItem(): cmLinkItem(), Backtrace(), FromGenex(false) {}